

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O0

void __thiscall iqxmlrpc::Parser::parse(Parser *this,BuilderBase *builder)

{
  BuilderBase *pBVar1;
  bool bVar2;
  int iVar3;
  type pIVar4;
  ulong uVar5;
  size_t in_RCX;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  string local_90;
  string local_70;
  string local_40;
  uint local_1d;
  byte local_19;
  BuilderBase *pBStack_18;
  ParseStep p;
  BuilderBase *builder_local;
  Parser *this_local;
  
  pBStack_18 = builder;
  pIVar4 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
  uVar5 = Impl::read(pIVar4,(int)builder,__buf,in_RCX);
  local_1d = (uint)uVar5;
  local_19 = (byte)(uVar5 >> 0x20);
  while( true ) {
    pBVar1 = pBStack_18;
    __nbytes = uVar5 & 0xffffffff;
    if ((((byte)local_1d ^ 0xff) & 1) == 0) {
      return;
    }
    if ((local_1d & 0x100) == 0) {
      if ((local_1d & 0x10000) == 0) {
        if (((local_19 & 1) != 0) &&
           (bVar2 = BuilderBase::expects_text(pBStack_18), pBVar1 = pBStack_18, bVar2)) {
          builder = (BuilderBase *)&local_90;
          get_data_abi_cxx11_((string *)builder,this);
          BuilderBase::visit_text(pBVar1,(string *)builder);
          std::__cxx11::string::~string((string *)&local_90);
        }
      }
      else {
        iVar3 = BuilderBase::depth(pBStack_18);
        pBVar1 = pBStack_18;
        if (iVar3 == 0) {
          pIVar4 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
          pIVar4->pushed_back = true;
          return;
        }
        pIVar4 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
        builder = (BuilderBase *)&local_70;
        Impl::tag_name_abi_cxx11_((string *)builder,pIVar4);
        BuilderBase::visit_element_end(pBVar1,(string *)builder);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    else {
      pIVar4 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
      builder = (BuilderBase *)&local_40;
      Impl::tag_name_abi_cxx11_((string *)builder,pIVar4);
      BuilderBase::visit_element(pBVar1,(string *)builder);
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar2 = BuilderBase::wants_exit(pBStack_18);
    if (bVar2) break;
    pIVar4 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
    uVar5 = Impl::read(pIVar4,(int)builder,__buf_00,__nbytes);
    local_1d = (uint)uVar5;
    local_19 = (byte)(uVar5 >> 0x20);
  }
  return;
}

Assistant:

void
Parser::parse(BuilderBase& builder)
{
  for (Impl::ParseStep p = impl_->read(); !p.done; p = impl_->read()) {
    if (p.element_begin) {
      builder.visit_element(impl_->tag_name());

    } else if (p.element_end) {
      if (!builder.depth()) {
        impl_->pushed_back = true;
        break;
      }

      builder.visit_element_end(impl_->tag_name());

    } else if (p.is_text && builder.expects_text()) {
      builder.visit_text(get_data());
    }

    if (builder.wants_exit())
      break;

  } // for
}